

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O0

int run_test_handle_type_name(void)

{
  int iVar1;
  char *pcVar2;
  void *eval_b_5;
  void *eval_a_5;
  void *eval_b_4;
  void *eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  pcVar2 = uv_handle_type_name(UV_NAMED_PIPE);
  iVar1 = strcmp(pcVar2,"pipe");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x25,"strcmp(uv_handle_type_name(UV_NAMED_PIPE), \"pipe\")","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  pcVar2 = uv_handle_type_name(UV_UDP);
  iVar1 = strcmp(pcVar2,"udp");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x26,"strcmp(uv_handle_type_name(UV_UDP), \"udp\")","==","0",(long)iVar1,"==",0);
    abort();
  }
  pcVar2 = uv_handle_type_name(UV_FILE);
  iVar1 = strcmp(pcVar2,"file");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x27,"strcmp(uv_handle_type_name(UV_FILE), \"file\")","==","0",(long)iVar1,"==",0);
    abort();
  }
  pcVar2 = uv_handle_type_name(UV_HANDLE_TYPE_MAX);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x28,"uv_handle_type_name(UV_HANDLE_TYPE_MAX)","==","NULL",pcVar2,"==",0);
    abort();
  }
  pcVar2 = uv_handle_type_name(UV_HANDLE_TYPE_MAX|UV_ASYNC);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x29,"uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1)","==","NULL",pcVar2,"==",0);
    abort();
  }
  pcVar2 = uv_handle_type_name(UV_UNKNOWN_HANDLE);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
            ,0x2a,"uv_handle_type_name(UV_UNKNOWN_HANDLE)","==","NULL",pcVar2,"==",0);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(handle_type_name) {
  ASSERT_OK(strcmp(uv_handle_type_name(UV_NAMED_PIPE), "pipe"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_UDP), "udp"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_FILE), "file"));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1));
  ASSERT_NULL(uv_handle_type_name(UV_UNKNOWN_HANDLE));
  return 0;
}